

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alteration_notifier.h
# Opt level: O0

void __thiscall
lemon::
AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::
detach(AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
       *this,ObserverBase *observer)

{
  iterator iVar1;
  long in_RSI;
  list<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*>_>
  *in_RDI;
  _List_node_base **this_00;
  const_iterator in_stack_ffffffffffffffd8;
  _List_const_iterator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*>
  local_18;
  long local_10;
  
  local_10 = in_RSI;
  bits::Lock::lock((Lock *)0x2c5591);
  this_00 = &(in_RDI->
             super__List_base<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*>_>
             )._M_impl._M_node.super__List_node_base._M_prev;
  std::
  _List_const_iterator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*>
  ::_List_const_iterator(&local_18,(iterator *)(local_10 + 0x10));
  std::__cxx11::
  list<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*>_>
  ::erase(in_RDI,in_stack_ffffffffffffffd8);
  iVar1 = std::__cxx11::
          list<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*>_>
          ::end((list<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>::ObserverBase_*>_>
                 *)this_00);
  *(_List_node_base **)(local_10 + 0x10) = iVar1._M_node;
  *(undefined8 *)(local_10 + 8) = 0;
  bits::Lock::unlock((Lock *)0x2c5600);
  return;
}

Assistant:

void detach(ObserverBase& observer) {
    _lock.lock();
    _observers.erase(observer._index);
    observer._index    = _observers.end();
    observer._notifier = 0;
    _lock.unlock();
  }